

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty-test.c++
# Opt level: O2

PipeThread *
capnp::_::anon_unknown_0::runServer
          (PipeThread *__return_storage_ptr__,AsyncIoProvider *ioProvider,int *callCount,
          int *handleCount)

{
  Own<kj::Function<void_(kj::AsyncIoProvider_&,_kj::AsyncIoStream_&,_kj::WaitScope_&)>::Iface,_std::nullptr_t>
  local_30;
  
  local_30.ptr = (Iface *)operator_new(0x18);
  (local_30.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___006524d0;
  local_30.ptr[1]._vptr_Iface = (_func_int **)callCount;
  local_30.ptr[2]._vptr_Iface = (_func_int **)handleCount;
  local_30.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<void(kj::AsyncIoProvider&,kj::AsyncIoStream&,kj::WaitScope&)>::Impl<capnp::_::(anonymous_namespace)::runServer(kj::AsyncIoProvider&,int&,int&)::$_0>>
        ::instance;
  (*ioProvider->_vptr_AsyncIoProvider[4])(__return_storage_ptr__,ioProvider);
  kj::
  Own<kj::Function<void_(kj::AsyncIoProvider_&,_kj::AsyncIoStream_&,_kj::WaitScope_&)>::Iface,_std::nullptr_t>
  ::dispose(&local_30);
  return __return_storage_ptr__;
}

Assistant:

kj::AsyncIoProvider::PipeThread runServer(kj::AsyncIoProvider& ioProvider,
                                          int& callCount, int& handleCount) {
  return ioProvider.newPipeThread(
      [&callCount, &handleCount](
       kj::AsyncIoProvider& ioProvider, kj::AsyncIoStream& stream, kj::WaitScope& waitScope) {
    TwoPartyVatNetwork network(stream, rpc::twoparty::Side::SERVER);
    auto server = makeRpcServer(network, kj::heap<TestInterfaceImpl>(callCount, handleCount));
    network.onDisconnect().wait(waitScope);
  });
}